

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  cmMakefile *this_00;
  bool bVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  string *psVar4;
  ulong uVar5;
  char *pcVar6;
  string local_6c0;
  string local_6a0 [32];
  string local_680;
  undefined1 local_660 [8];
  ostringstream emsg_1;
  undefined1 local_4e8 [8];
  ifstream ifs;
  undefined1 local_2e0 [8];
  string outputFileLocation;
  string local_2b8 [32];
  string local_298;
  undefined1 local_278 [8];
  ostringstream emsg;
  undefined1 local_100 [8];
  string command;
  string local_d8;
  undefined1 local_b8 [8];
  string cfg;
  string local_90;
  undefined1 local_70 [8];
  string tcConfig;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string tmpOutputFile;
  string *targetName_local;
  cmCoreTryCompile *this_local;
  
  tmpOutputFile.field_2._8_8_ = targetName;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"/",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::operator+=((string *)local_38,(string *)tmpOutputFile.field_2._8_8_);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x28])();
  if ((uVar2 & 1) != 0) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_TRY_COMPILE_CONFIGURATION",
               (allocator<char> *)(cfg.field_2._M_local_buf + 0xf));
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_90);
    std::__cxx11::string::string((string *)local_70,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(cfg.field_2._M_local_buf + 0xf));
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmsys::SystemTools::UpperCase((string *)local_b8,(string *)local_70);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_b8,
                 (string *)(anonymous_namespace)::TryCompileDefaultConfig_abi_cxx11_);
    }
    command.field_2._M_local_buf[0xf] = '_';
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
              (&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               command.field_2._M_local_buf + 0xf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::operator+=((string *)local_38,"_loc");
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
            ((string *)local_100,&this->BinaryDirectory,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_100);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_2e0);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_4e8,pcVar6,_S_in);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)local_4e8,(string *)local_2e0,(bool *)0x0,0xffffffffffffffff);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_2e0);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath(&local_6c0,(string *)local_2e0);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6c0);
      outputFileLocation.field_2._12_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_660);
      std::operator<<((ostream *)local_660,"Recorded try_compile output location doesn\'t exist:\n")
      ;
      cmStrCat<char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (&local_680,(char (*) [3])0x105f7f5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 (char (*) [2])0x107b5a6);
      std::operator<<((ostream *)local_660,(string *)&local_680);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,local_6a0);
      std::__cxx11::string::~string(local_6a0);
      outputFileLocation.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_660);
    }
    std::ifstream::~ifstream(local_4e8);
    std::__cxx11::string::~string((string *)local_2e0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::operator<<((ostream *)local_278,
                    "Unable to find the recorded try_compile output location:\n");
    cmStrCat<char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_298,(char (*) [3])0x105f7f5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
               (char (*) [2])0x107b5a6);
    std::operator<<((ostream *)local_278,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    outputFileLocation.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  }
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    std::string const tcConfig =
      this->Makefile->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
    std::string const cfg = !tcConfig.empty()
      ? cmSystemTools::UpperCase(tcConfig)
      : TryCompileDefaultConfig;
    tmpOutputFile = cmStrCat(tmpOutputFile, '_', cfg);
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}